

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::auxDefineFlows(Graph *this,Vertex *v,Vertex *v_previous)

{
  bool bVar1;
  ostream *this_00;
  Vertex *pVVar2;
  bool bVar3;
  Edge *local_28;
  Edge *e;
  Vertex *v_previous_local;
  Vertex *v_local;
  Graph *this_local;
  
  if (v == (Vertex *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"\n No NULL \n");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    for (local_28 = Vertex::getEdgesList(v); local_28 != (Edge *)0x0;
        local_28 = Edge::getNext(local_28)) {
      while( true ) {
        bVar3 = false;
        if (local_28 != (Edge *)0x0) {
          bVar1 = Edge::isClosed(local_28);
          bVar3 = true;
          if (bVar1) {
            pVVar2 = Edge::getDestiny(local_28);
            bVar3 = pVVar2 == v_previous;
          }
        }
        if (!bVar3) break;
        Edge::setActiveFlow(local_28,0.0);
        Edge::setReactiveFlow(local_28,0.0);
        Edge::setActiveLoss(local_28,0.0);
        Edge::setReactiveLoss(local_28,0.0);
        pVVar2 = Edge::getDestiny(local_28);
        if (pVVar2 == v_previous) {
          Edge::setSwitch(local_28,false);
        }
        local_28 = Edge::getNext(local_28);
      }
      if (local_28 == (Edge *)0x0) {
        return;
      }
      pVVar2 = Edge::getDestiny(local_28);
      auxDefineFlows(this,pVVar2,v);
    }
  }
  return;
}

Assistant:

void Graph::auxDefineFlows(Vertex *v, Vertex *v_previous){
    if(v == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        for(Edge *e= v->getEdgesList(); e!=NULL; e= e->getNext()){

            //nao descer por arcos com chave aberta e descer no sentido correto
            //e->getNoDestino()==v e o arco de volta do arco 'a' assim nao passamos por ele
            while(e!=NULL && (e->isClosed() == false || e->getDestiny()==v_previous) ){

                //nao tem fluxo nem perda em arcos abertos
                e->setActiveFlow(0.0);
                e->setReactiveFlow(0.0);
                e->setActiveLoss(0.0);
                e->setReactiveLoss(0.0);

                if(e->getDestiny()==v_previous)
                    e->setSwitch(false);

                e = e->getNext();
            }
            if(e==NULL)     break;

            auxDefineFlows(e->getDestiny(), v);
        }
    }
}